

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forkSort.c
# Opt level: O2

int main(int argc,char **argv)

{
  char *__s;
  int iVar1;
  __pid_t _Var2;
  __pid_t __pid;
  undefined8 *__ptr;
  __ssize_t _Var3;
  size_t sVar4;
  FILE *__stream;
  FILE *pFVar5;
  __ssize_t _Var6;
  int in_ECX;
  ulong uVar7;
  char *pcVar8;
  ulong uVar9;
  ulong uVar10;
  char *line1;
  char *line2;
  FILE *local_70;
  int pipes [4] [2];
  size_t length2;
  size_t length1;
  
  fileName = *argv;
  if (argc != 1) {
    pcVar8 = "USAGE:\t%s\n";
    goto LAB_0010136d;
  }
  __ptr = (undefined8 *)malloc(800);
  uVar9 = 0;
  while( true ) {
    pipes[0][0] = 0;
    pipes[0][1] = 0;
    line1 = (char *)0x0;
    _Var3 = getline((char **)pipes,(size_t *)&line1,_stdin);
    if (_Var3 == -1) break;
    *(int (*) [2])(__ptr + uVar9) = pipes[0];
    uVar9 = uVar9 + 1;
  }
  free((void *)pipes[0]);
  if (uVar9 == 1) {
    pcVar8 = (char *)*__ptr;
    fputs(pcVar8,_stdout);
    free(pcVar8);
    free(__ptr);
    goto LAB_001012f3;
  }
  iVar1 = pipe(pipes[0]);
  if ((((iVar1 == -1) || (iVar1 = pipe(pipes[2]), iVar1 == -1)) ||
      (iVar1 = pipe(pipes[1]), iVar1 == -1)) || (iVar1 = pipe(pipes[3]), iVar1 == -1)) {
    pcVar8 = "%s ERROR: Pipe-Error\n";
    goto LAB_0010136d;
  }
  _Var2 = fork();
  if (_Var2 == 0) {
    dup_needed_pipes((int)pipes,(int (*) [2])0x2,0,in_ECX);
    iVar1 = execlp(fileName,fileName,0);
    if (iVar1 != -1) goto LAB_001013b5;
LAB_00101409:
    pcVar8 = "%s ERROR: execlp-Error\n";
    goto LAB_0010136d;
  }
  if (_Var2 == -1) {
LAB_001013c7:
    pcVar8 = "%s ERROR: fork-Error\n";
  }
  else {
LAB_001013b5:
    __pid = fork();
    if (__pid == 0) {
      dup_needed_pipes((int)pipes,(int (*) [2])0x3,1,in_ECX);
      iVar1 = execlp(fileName,fileName,0);
      if (iVar1 == -1) goto LAB_00101409;
    }
    else if (__pid == -1) goto LAB_001013c7;
    local_70 = (FILE *)CONCAT44(local_70._4_4_,_Var2);
    close(pipes[0][0]);
    close(pipes[1][0]);
    close(pipes[2][1]);
    close(pipes[3][1]);
    uVar10 = uVar9 >> 1 & 0x7fffffff;
    for (uVar7 = 0; uVar10 != uVar7; uVar7 = uVar7 + 1) {
      iVar1 = pipes[0][1];
      pcVar8 = (char *)__ptr[uVar7];
      sVar4 = strlen(pcVar8);
      write(iVar1,pcVar8,sVar4);
      free(pcVar8);
    }
    _Var2 = (__pid_t)local_70;
    for (; iVar1 = pipes[1][1], uVar10 < (uVar9 & 0xffffffff); uVar10 = uVar10 + 1) {
      pcVar8 = (char *)__ptr[uVar10];
      sVar4 = strlen(pcVar8);
      write(iVar1,pcVar8,sVar4);
      free(pcVar8);
    }
    free(__ptr);
    close(pipes[0][1]);
    close(pipes[1][1]);
    waitpid(_Var2,(int *)&line1,0);
    if (line1._1_1_ == '\0') {
      waitpid(__pid,(int *)&line1,0);
      if (line1._1_1_ == '\0') {
        __stream = fdopen(pipes[2][0],"r");
        pFVar5 = fdopen(pipes[3][0],"r");
        line1 = (char *)0x0;
        line2 = (char *)0x0;
        length1 = 0;
        length2 = 0;
        _Var3 = getline(&line1,&length1,__stream);
        local_70 = pFVar5;
        _Var6 = getline(&line2,&length2,pFVar5);
        do {
          __s = line2;
          pcVar8 = line1;
          iVar1 = strcmp(line1,line2);
          if (iVar1 < 0) {
            fputs(pcVar8,_stdout);
            _Var3 = getline(&line1,&length1,__stream);
          }
          else {
            fputs(__s,_stdout);
            _Var6 = getline(&line2,&length2,local_70);
          }
        } while ((_Var3 != -1) && (_Var6 != -1));
        while (pFVar5 = local_70, _Var3 != -1) {
          fputs(line1,_stdout);
          _Var3 = getline(&line1,&length1,__stream);
        }
        while (_Var6 != -1) {
          fputs(line2,_stdout);
          _Var6 = getline(&line2,&length2,pFVar5);
        }
        free(line1);
        free(line2);
        fclose(__stream);
        fclose(pFVar5);
LAB_001012f3:
        fprintf(_stderr,"%s Success\n",fileName);
        exit(0);
      }
    }
    pcVar8 = "%s ERROR: error in child\n";
  }
LAB_0010136d:
  fprintf(_stderr,pcVar8,fileName);
  exit(1);
}

Assistant:

int main(int argc, char *argv[])
{
	fileName = argv[0];

	int counter = 0;

	if (argc != 1)
	{
		USAGE();
	}

	char **readString = get_input(&counter);

	if (counter == 1)
	{
		fprintf(stdout, "%s", readString[0]);

		free(readString[0]);
		free(readString);

		SUCCESS_EXIT();
	}

	int pipes[4][2];

	if (pipe(pipes[PIPE_1_WRITE]) == -1 || pipe(pipes[PIPE_1_READ]) == -1 || pipe(pipes[PIPE_2_WRITE]) == -1 || pipe(pipes[PIPE_2_READ]) == -1)
	{
		ERROR_EXIT("Pipe-Error");
	}

	int p1, p2; //first child process

	create_child_process(pipes, &p1, &p2);

	close(pipes[PIPE_1_WRITE][READ]);
	close(pipes[PIPE_2_WRITE][READ]);
	close(pipes[PIPE_1_READ][WRITE]);
	close(pipes[PIPE_2_READ][WRITE]);

	write_to_child_process(pipes,counter, readString);

	close(pipes[PIPE_1_WRITE][WRITE]);
	close(pipes[PIPE_2_WRITE][WRITE]);

    wait_for_child_process(p1, p2);

	FILE *file1 = fdopen(pipes[PIPE_1_READ][READ], "r"); //opens pipe as file
	FILE *file2 = fdopen(pipes[PIPE_2_READ][READ], "r"); //opens pipe as file

	
	char *line1 = NULL;
	char *line2 = NULL;
	size_t length1 = 0;
	size_t length2 = 0;
	ssize_t ret1 = getline(&line1, &length1, file1);
	ssize_t ret2 = getline(&line2, &length2, file2);

	// fetch one line from both
	// compare
	// print smaller and fetch a new one from that one
	// repeat till out of lines
	do
	{
		if (strcmp(line1, line2) < 0)
		{
			fprintf(stdout, "%s", line1);
			ret1 = getline(&line1, &length1, file1);
		}
		else{
			fprintf(stdout, "%s", line2);
			ret2 = getline(&line2, &length2, file2);
		}

	} while (ret1 != -1 && ret2 != -1);

	// if lines remain print them all
	while(ret1 != -1){
		fprintf(stdout,"%s", line1);
				
		ret1 = getline(&line1, &length1, file1);
	}

	while(ret2 != -1){
		fprintf(stdout,"%s", line2);
				
		ret2 = getline(&line2, &length2, file2);
	}

	free(line1);
	free(line2);

	fclose(file1);
	fclose(file2);


	SUCCESS_EXIT();
}